

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O2

void __thiscall
DIS::ResupplyReceivedPdu::unmarshal(ResupplyReceivedPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  SupplyQuantity x;
  SupplyQuantity SStack_48;
  
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_receivingEntityID,dataStream);
  EntityID::unmarshal(&this->_supplyingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfSupplyTypes);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  for (uVar1 = 0; uVar1 < this->_numberOfSupplyTypes; uVar1 = uVar1 + 1) {
    SupplyQuantity::SupplyQuantity(&SStack_48);
    SupplyQuantity::unmarshal(&SStack_48,dataStream);
    std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::push_back
              (&this->_supplies,&SStack_48);
    SupplyQuantity::~SupplyQuantity(&SStack_48);
  }
  return;
}

Assistant:

void ResupplyReceivedPdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _receivingEntityID.unmarshal(dataStream);
    _supplyingEntityID.unmarshal(dataStream);
    dataStream >> _numberOfSupplyTypes;
    dataStream >> _padding1;
    dataStream >> _padding2;

     _supplies.clear();
     for(size_t idx = 0; idx < _numberOfSupplyTypes; idx++)
     {
        SupplyQuantity x;
        x.unmarshal(dataStream);
        _supplies.push_back(x);
     }
}